

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::globalQualifierFixCheck
          (TParseContext *this,TSourceLoc *loc,TQualifier *qualifier,bool isMemberCheck,
          TPublicType *publicType)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  TBasicType imageType;
  TLayoutFormat TVar4;
  bool nonuniformOkay;
  TPublicType *publicType_local;
  bool isMemberCheck_local;
  TQualifier *qualifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  bVar3 = false;
  switch((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) {
  case 0:
  case 1:
    bVar3 = true;
    break;
  default:
    break;
  case 5:
    if ((this->blockName == (TString *)0x0) && ((qualifier->field_0x10 & 0xf) == 3)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,1,&E_GL_EXT_scalar_block_layout,"default std430 layout for uniform");
    }
    if ((((publicType != (TPublicType *)0x0) && (bVar2 = TPublicType::isImage(publicType), bVar2))
        && (0x2f < (byte)qualifier->field_0x2c)) && ((byte)qualifier->field_0x2c < 0x35)) {
      bVar1 = qualifier->field_0x2c;
      imageType = TSampler::getBasicType(&publicType->sampler);
      TVar4 = mapLegacyLayoutFormat(this,(uint)bVar1,imageType);
      qualifier->field_0x2c = (char)TVar4;
    }
    break;
  case 0x10:
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,1,0x82,(char *)0x0,"in for stage inputs");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,8,300,(char *)0x0,"in for stage inputs");
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 3;
    bVar3 = true;
    break;
  case 0x11:
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,1,0x82,(char *)0x0,"out for stage outputs");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,8,300,(char *)0x0,"out for stage outputs");
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 4;
    bVar2 = TIntermediate::isInvariantAll
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    if (bVar2) {
      *(ulong *)&qualifier->field_0x8 =
           *(ulong *)&qualifier->field_0x8 & 0xffffffffefffffff | 0x10000000;
    }
    break;
  case 0x12:
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 3;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot use \'inout\' at global scope","");
  }
  if ((!bVar3) && (bVar3 = TQualifier::isNonUniform(qualifier), bVar3)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"for non-parameter, can only apply to \'in\' or no storage qualifier",
               "nonuniformEXT","");
  }
  bVar3 = TQualifier::isSpirvByReference(qualifier);
  if (bVar3) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to parameter","spirv_by_reference","");
  }
  bVar3 = TQualifier::isSpirvLiteral(qualifier);
  if (bVar3) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only apply to parameter","spirv_literal","");
  }
  if ((!isMemberCheck) || (0 < (this->super_TParseContextBase).structNestingLevel)) {
    invariantCheck(this,loc,qualifier);
  }
  bVar3 = TQualifier::isFullQuads(qualifier);
  if (bVar3) {
    if (((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) != 3) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to input layout","full_quads ","");
    }
    TIntermediate::setReqFullQuadsMode
              ((this->super_TParseContextBase).super_TParseVersions.intermediate,true);
  }
  bVar3 = TQualifier::isQuadDeriv(qualifier);
  if (bVar3) {
    if (((uint)*(undefined8 *)&qualifier->field_0x8 & 0x7f) != 3) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only apply to input layout","quad_derivatives","");
    }
    TIntermediate::setQuadDerivMode
              ((this->super_TParseContextBase).super_TParseVersions.intermediate,true);
  }
  return;
}

Assistant:

void TParseContext::globalQualifierFixCheck(const TSourceLoc& loc, TQualifier& qualifier, bool isMemberCheck, const TPublicType* publicType)
{
    bool nonuniformOkay = false;

    // move from parameter/unknown qualifiers to pipeline in/out qualifiers
    switch (qualifier.storage) {
    case EvqIn:
        profileRequires(loc, ENoProfile, 130, nullptr, "in for stage inputs");
        profileRequires(loc, EEsProfile, 300, nullptr, "in for stage inputs");
        qualifier.storage = EvqVaryingIn;
        nonuniformOkay = true;
        break;
    case EvqOut:
        profileRequires(loc, ENoProfile, 130, nullptr, "out for stage outputs");
        profileRequires(loc, EEsProfile, 300, nullptr, "out for stage outputs");
        qualifier.storage = EvqVaryingOut;
        if (intermediate.isInvariantAll())
            qualifier.invariant = true;
        break;
    case EvqInOut:
        qualifier.storage = EvqVaryingIn;
        error(loc, "cannot use 'inout' at global scope", "", "");
        break;
    case EvqGlobal:
    case EvqTemporary:
        nonuniformOkay = true;
        break;
    case EvqUniform:
        // According to GLSL spec: The std430 qualifier is supported only for shader storage blocks; a shader using
        // the std430 qualifier on a uniform block will fail to compile.
        // Only check the global declaration: layout(std430) uniform;
        if (blockName == nullptr &&
            qualifier.layoutPacking == ElpStd430)
        {
            requireExtensions(loc, 1, &E_GL_EXT_scalar_block_layout, "default std430 layout for uniform");
        }

        if (publicType != nullptr && publicType->isImage() &&
            (qualifier.layoutFormat > ElfExtSizeGuard && qualifier.layoutFormat < ElfCount))
            qualifier.layoutFormat = mapLegacyLayoutFormat(qualifier.layoutFormat, publicType->sampler.getBasicType());

        break;
    default:
        break;
    }

    if (!nonuniformOkay && qualifier.isNonUniform())
        error(loc, "for non-parameter, can only apply to 'in' or no storage qualifier", "nonuniformEXT", "");

    if (qualifier.isSpirvByReference())
        error(loc, "can only apply to parameter", "spirv_by_reference", "");

    if (qualifier.isSpirvLiteral())
        error(loc, "can only apply to parameter", "spirv_literal", "");

    // Storage qualifier isn't ready for memberQualifierCheck, we should skip invariantCheck for it.
    if (!isMemberCheck || structNestingLevel > 0)
        invariantCheck(loc, qualifier);

    if (qualifier.isFullQuads()) {
        if (qualifier.storage != EvqVaryingIn)
            error(loc, "can only apply to input layout", "full_quads ", "");
        intermediate.setReqFullQuadsMode();
    }

    if (qualifier.isQuadDeriv()) {
        if (qualifier.storage != EvqVaryingIn)
            error(loc, "can only apply to input layout", "quad_derivatives", "");
        intermediate.setQuadDerivMode();
    }
}